

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

DETACH_HANDLE detach_clone(DETACH_HANDLE value)

{
  DETACH_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (DETACH_HANDLE)malloc(8);
  if (__ptr != (DETACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (DETACH_HANDLE)0x0;
}

Assistant:

DETACH_HANDLE detach_clone(DETACH_HANDLE value)
{
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)malloc(sizeof(DETACH_INSTANCE));
    if (detach_instance != NULL)
    {
        detach_instance->composite_value = amqpvalue_clone(((DETACH_INSTANCE*)value)->composite_value);
        if (detach_instance->composite_value == NULL)
        {
            free(detach_instance);
            detach_instance = NULL;
        }
    }

    return detach_instance;
}